

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void find_best_colors(j_decompress_ptr cinfo,int minc0,int minc1,int minc2,int numcolors,
                     JSAMPLE *colorlist,JSAMPLE *bestcolor)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  undefined1 *in_stack_00000008;
  JLONG inc2;
  JLONG inc1;
  JLONG inc0;
  JLONG xx2;
  JLONG xx1;
  JLONG xx0;
  JLONG dist2;
  JLONG dist1;
  JLONG dist0;
  JSAMPLE *cptr;
  JLONG *bptr;
  int icolor;
  int i;
  int ic2;
  int ic1;
  int ic0;
  long local_498 [129];
  long local_90;
  long local_88;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 *local_48;
  long *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_40 = local_498;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_30 = 0x7f; -1 < local_30; local_30 = local_30 + -1) {
    plVar1 = local_40 + 1;
    *local_40 = 0x7fffffff;
    local_40 = plVar1;
  }
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    local_34 = (uint)*(byte *)(local_20 + local_30);
    lVar2 = (long)(int)((local_c -
                        (uint)*(byte *)(**(long **)(local_8 + 0xa0) + (long)(int)local_34)) *
                       c_scales[rgb_red[*(uint *)(local_8 + 0x40)]]);
    lVar3 = (long)(int)((local_10 -
                        (uint)*(byte *)(*(long *)(*(long *)(local_8 + 0xa0) + 8) +
                                       (long)(int)local_34)) *
                       c_scales[rgb_green[*(uint *)(local_8 + 0x40)]]);
    lVar4 = (long)(int)((local_14 -
                        (uint)*(byte *)(*(long *)(*(long *)(local_8 + 0xa0) + 0x10) +
                                       (long)(int)local_34)) *
                       c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]]);
    local_50 = lVar4 * lVar4 + lVar3 * lVar3 + lVar2 * lVar2;
    local_68 = lVar2 * (c_scales[rgb_red[*(uint *)(local_8 + 0x40)]] << 4) +
               (long)(c_scales[rgb_red[*(uint *)(local_8 + 0x40)]] * 8 *
                     c_scales[rgb_red[*(uint *)(local_8 + 0x40)]] * 8);
    local_88 = lVar3 * (c_scales[rgb_green[*(uint *)(local_8 + 0x40)]] << 3) +
               (long)(c_scales[rgb_green[*(uint *)(local_8 + 0x40)]] * 4 *
                     c_scales[rgb_green[*(uint *)(local_8 + 0x40)]] * 4);
    local_90 = lVar4 * (c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]] << 4) +
               (long)(c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]] * 8 *
                     c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]] * 8);
    local_40 = local_498;
    local_48 = in_stack_00000008;
    for (local_24 = 3; -1 < local_24; local_24 = local_24 + -1) {
      local_58 = local_50;
      local_70 = local_88;
      for (local_28 = 7; -1 < local_28; local_28 = local_28 + -1) {
        local_60 = local_58;
        local_78 = local_90;
        for (local_2c = 3; -1 < local_2c; local_2c = local_2c + -1) {
          if (local_60 < *local_40) {
            *local_40 = local_60;
            *local_48 = (char)local_34;
          }
          local_60 = local_78 + local_60;
          local_78 = c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]] * 0x10 *
                     c_scales[rgb_blue[*(uint *)(local_8 + 0x40)]] * 8 + local_78;
          local_40 = local_40 + 1;
          local_48 = local_48 + 1;
        }
        local_58 = local_70 + local_58;
        local_70 = c_scales[rgb_green[*(uint *)(local_8 + 0x40)]] * 8 *
                   c_scales[rgb_green[*(uint *)(local_8 + 0x40)]] * 4 + local_70;
      }
      local_50 = local_68 + local_50;
      local_68 = c_scales[rgb_red[*(uint *)(local_8 + 0x40)]] * 0x10 *
                 c_scales[rgb_red[*(uint *)(local_8 + 0x40)]] * 8 + local_68;
    }
  }
  return;
}

Assistant:

LOCAL(void)
find_best_colors(j_decompress_ptr cinfo, int minc0, int minc1, int minc2,
                 int numcolors, JSAMPLE colorlist[], JSAMPLE bestcolor[])
/* Find the closest colormap entry for each cell in the update box,
 * given the list of candidate colors prepared by find_nearby_colors.
 * Return the indexes of the closest entries in the bestcolor[] array.
 * This routine uses Thomas' incremental distance calculation method to
 * find the distance from a colormap entry to successive cells in the box.
 */
{
  int ic0, ic1, ic2;
  int i, icolor;
  register JLONG *bptr;         /* pointer into bestdist[] array */
  JSAMPLE *cptr;                /* pointer into bestcolor[] array */
  JLONG dist0, dist1;           /* initial distance values */
  register JLONG dist2;         /* current distance in inner loop */
  JLONG xx0, xx1;               /* distance increments */
  register JLONG xx2;
  JLONG inc0, inc1, inc2;       /* initial values for increments */
  /* This array holds the distance to the nearest-so-far color for each cell */
  JLONG bestdist[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Initialize best-distance for each cell of the update box */
  bptr = bestdist;
  for (i = BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS - 1; i >= 0; i--)
    *bptr++ = 0x7FFFFFFFL;

  /* For each color selected by find_nearby_colors,
   * compute its distance to the center of each cell in the box.
   * If that's less than best-so-far, update best distance and color number.
   */

  /* Nominal steps between cell centers ("x" in Thomas article) */
#define STEP_C0  ((1 << C0_SHIFT) * C0_SCALE)
#define STEP_C1  ((1 << C1_SHIFT) * C1_SCALE)
#define STEP_C2  ((1 << C2_SHIFT) * C2_SCALE)

  for (i = 0; i < numcolors; i++) {
    icolor = colorlist[i];
    /* Compute (square of) distance from minc0/c1/c2 to this color */
    inc0 = (minc0 - cinfo->colormap[0][icolor]) * C0_SCALE;
    dist0 = inc0 * inc0;
    inc1 = (minc1 - cinfo->colormap[1][icolor]) * C1_SCALE;
    dist0 += inc1 * inc1;
    inc2 = (minc2 - cinfo->colormap[2][icolor]) * C2_SCALE;
    dist0 += inc2 * inc2;
    /* Form the initial difference increments */
    inc0 = inc0 * (2 * STEP_C0) + STEP_C0 * STEP_C0;
    inc1 = inc1 * (2 * STEP_C1) + STEP_C1 * STEP_C1;
    inc2 = inc2 * (2 * STEP_C2) + STEP_C2 * STEP_C2;
    /* Now loop over all cells in box, updating distance per Thomas method */
    bptr = bestdist;
    cptr = bestcolor;
    xx0 = inc0;
    for (ic0 = BOX_C0_ELEMS - 1; ic0 >= 0; ic0--) {
      dist1 = dist0;
      xx1 = inc1;
      for (ic1 = BOX_C1_ELEMS - 1; ic1 >= 0; ic1--) {
        dist2 = dist1;
        xx2 = inc2;
        for (ic2 = BOX_C2_ELEMS - 1; ic2 >= 0; ic2--) {
          if (dist2 < *bptr) {
            *bptr = dist2;
            *cptr = (JSAMPLE)icolor;
          }
          dist2 += xx2;
          xx2 += 2 * STEP_C2 * STEP_C2;
          bptr++;
          cptr++;
        }
        dist1 += xx1;
        xx1 += 2 * STEP_C1 * STEP_C1;
      }
      dist0 += xx0;
      xx0 += 2 * STEP_C0 * STEP_C0;
    }
  }
}